

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O3

BOOL CONTEXT_GetRegisters(DWORD processId,LPCONTEXT lpContext)

{
  uint __errnum;
  FILE *__stream;
  DWORD DVar1;
  long lVar2;
  uint *puVar3;
  char *pcVar4;
  undefined1 local_4a0 [120];
  unsigned_long local_428;
  unsigned_long uStack_420;
  unsigned_long local_418;
  unsigned_long local_410;
  unsigned_long uStack_408;
  unsigned_long local_400;
  unsigned_long local_3f8;
  unsigned_long local_3f0;
  undefined2 local_3e8;
  undefined4 local_d8;
  undefined4 uStack_d4;
  pt_regs ptrace_registers;
  
  DVar1 = GetCurrentProcessId();
  if (DVar1 == processId) {
    CONTEXT_CaptureContext(lpContext);
  }
  else {
    lVar2 = ptrace(PTRACE_GETREGS,(ulong)processId,&local_d8,0);
    if (lVar2 == -1) {
      fprintf(_stderr,"] %s %s:%d","CONTEXT_GetRegisters",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/context.cpp"
              ,0x166);
      __stream = _stderr;
      puVar3 = (uint *)__errno_location();
      __errnum = *puVar3;
      pcVar4 = strerror(__errnum);
      fprintf(__stream,"Failed ptrace(PT_GETREGS, processId:%d) errno:%d (%s)\n",(ulong)processId,
              (ulong)__errnum,pcVar4);
    }
    local_3f8 = ptrace_registers.orig_rax;
    local_3e8 = (undefined2)ptrace_registers.rip;
    local_3f0 = ptrace_registers.cs;
    local_400 = ptrace_registers.eflags;
    local_4a0._104_8_ = ptrace_registers.rsi;
    local_4a0._112_4_ = (int)ptrace_registers.rdx;
    local_4a0._116_4_ = ptrace_registers.rdx._4_4_;
    local_428 = ptrace_registers.r12;
    uStack_420 = ptrace_registers.rbp;
    local_418 = ptrace_registers.rcx;
    local_410 = ptrace_registers.r8;
    uStack_408 = ptrace_registers.rax;
    local_4a0._40_4_ = (undefined4)ptrace_registers.r9;
    local_4a0._44_4_ = ptrace_registers.r10._4_4_;
    local_4a0._48_4_ = (undefined4)ptrace_registers.r10;
    local_4a0._52_4_ = ptrace_registers.r10._4_4_;
    local_4a0._56_4_ = (undefined4)ptrace_registers.r11;
    local_4a0._60_4_ = ptrace_registers.rbx._4_4_;
    local_4a0._64_4_ = (undefined4)ptrace_registers.rbx;
    local_4a0._68_4_ = ptrace_registers.rbx._4_4_;
    local_4a0._72_4_ = (undefined4)ptrace_registers.r13;
    local_4a0._76_4_ = ptrace_registers.r14._4_4_;
    local_4a0._80_4_ = (undefined4)ptrace_registers.r14;
    local_4a0._84_4_ = ptrace_registers.r14._4_4_;
    local_4a0._88_4_ = (undefined4)ptrace_registers.r15;
    local_4a0._92_4_ = uStack_d4;
    local_4a0._96_4_ = local_d8;
    local_4a0._100_4_ = uStack_d4;
    CONTEXTFromNativeContext((native_context_t *)local_4a0,lpContext,lpContext->ContextFlags);
  }
  return 1;
}

Assistant:

BOOL CONTEXT_GetRegisters(DWORD processId, LPCONTEXT lpContext)
{
#if HAVE_BSD_REGS_T
    int regFd = -1;
#endif  // HAVE_BSD_REGS_T
    BOOL bRet = FALSE;

    if (processId == GetCurrentProcessId())
    {
        CONTEXT_CaptureContext(lpContext);
    }
    else
    {
        ucontext_t registers;
#if HAVE_PT_REGS
        struct pt_regs ptrace_registers;
        if (ptrace((__ptrace_request)PTRACE_GETREGS, processId, (caddr_t) &ptrace_registers, 0) == -1)
#elif HAVE_BSD_REGS_T
        struct reg ptrace_registers;
        if (PAL_PTRACE(PT_GETREGS, processId, &ptrace_registers, 0) == -1)
#endif
        {
            ASSERT("Failed ptrace(PT_GETREGS, processId:%d) errno:%d (%s)\n",
                   processId, errno, strerror(errno));
        }

#if HAVE_PT_REGS
#define ASSIGN_REG(reg) MCREG_##reg(registers.uc_mcontext) = PTREG_##reg(ptrace_registers);
#elif HAVE_BSD_REGS_T
#define ASSIGN_REG(reg) MCREG_##reg(registers.uc_mcontext) = BSDREG_##reg(ptrace_registers);
#else
#define ASSIGN_REG(reg)
	ASSERT("Don't know how to get the context of another process on this platform!");
	return bRet;
#endif
        ASSIGN_ALL_REGS
#undef ASSIGN_REG

        CONTEXTFromNativeContext(&registers, lpContext, lpContext->ContextFlags);
    }

    bRet = TRUE;
#if HAVE_BSD_REGS_T
    if (regFd != -1)
    {
        close(regFd);
    }
#endif  // HAVE_BSD_REGS_T
    return bRet;
}